

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pubkey.c
# Opt level: O0

X509_PUBKEY * ossl_d2i_X509_PUBKEY_INTERNAL(uchar **pp,long len,OSSL_LIB_CTX *libctx)

{
  void *pvVar1;
  size_t in_RDX;
  X509_PUBKEY *xpub;
  uchar **in_stack_00000030;
  ASN1_VALUE **in_stack_00000038;
  undefined8 in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  undefined8 local_8;
  
  pvVar1 = CRYPTO_zalloc(in_RDX,in_stack_ffffffffffffffd8,
                         (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
  if (pvVar1 == (void *)0x0) {
    local_8 = (X509_PUBKEY *)0x0;
  }
  else {
    X509_PUBKEY_INTERNAL_it();
    local_8 = (X509_PUBKEY *)
              ASN1_item_d2i_ex(in_stack_00000038,in_stack_00000030,(long)pp,(ASN1_ITEM *)len,libctx,
                               (char *)xpub);
  }
  return local_8;
}

Assistant:

X509_PUBKEY *ossl_d2i_X509_PUBKEY_INTERNAL(const unsigned char **pp,
                                           long len, OSSL_LIB_CTX *libctx)
{
    X509_PUBKEY *xpub = OPENSSL_zalloc(sizeof(*xpub));

    if (xpub == NULL)
        return NULL;
    return (X509_PUBKEY *)ASN1_item_d2i_ex((ASN1_VALUE **)&xpub, pp, len,
                                           ASN1_ITEM_rptr(X509_PUBKEY_INTERNAL),
                                           libctx, NULL);
}